

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O3

int __thiscall notch::core::MakeNet::init(MakeNet *this,EVP_PKEY_CTX *ctx)

{
  function<void_(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>_&,_std::valarray<float>_&,_int,_int)>
  *in_RDX;
  void *local_40;
  _Any_data local_38;
  _Manager_type local_28;
  
  Init::newRNG();
  std::
  function<void_(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>_&,_std::valarray<float>_&,_int,_int)>
  ::function((function<void_(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>_&,_std::valarray<float>_&,_int,_int)>
              *)&local_38,in_RDX);
  init(this,ctx);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  if (local_40 != (void *)0x0) {
    operator_delete(local_40);
  }
  return (int)this;
}

Assistant:

Net init(WeightInit init = Init::normalXavier) {
        std::unique_ptr<RNG> rng(Init::newRNG());
        Net net = this->init(rng, init);
        return net;
    }